

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mytools.cpp
# Opt level: O2

int myexec(char *cmd,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *resvec,bool dispResult)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  size_t sVar3;
  ostream *poVar4;
  allocator local_459;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  char tmp [1024];
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(resvec);
  __stream = popen(cmd,"r");
  if (__stream == (FILE *)0x0) {
    iVar1 = -1;
  }
  else {
    while( true ) {
      pcVar2 = fgets(tmp,0x400,__stream);
      if (pcVar2 == (char *)0x0) break;
      sVar3 = strlen(tmp);
      if (tmp[sVar3 - 1] == '\n') {
        tmp[sVar3 - 1] = '\0';
      }
      if (dispResult) {
        poVar4 = std::operator<<((ostream *)&std::cout,tmp);
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      std::__cxx11::string::string((string *)&local_458,tmp,&local_459);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)resvec,
                 &local_458);
      std::__cxx11::string::~string((string *)&local_458);
    }
    pclose(__stream);
    iVar1 = (int)((ulong)((long)(resvec->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(resvec->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 5);
  }
  return iVar1;
}

Assistant:

int myexec(const char *cmd, vector<string> &resvec, bool dispResult)
{
    resvec.clear();
    FILE *pp = popen(cmd, "r");         //建立管道
    if(!pp) {
        return -1;
    }
    char tmp[1024];                     //设置一个合适的长度，以存储每一行输出
    while(fgets(tmp, sizeof(tmp), pp) != NULL) {
        if(tmp[strlen(tmp) - 1] == '\n') {
            tmp[strlen(tmp) - 1] = '\0';//去除换行符
        }
        if(dispResult) {
            cout<<tmp<<endl;
        }
        resvec.push_back(tmp);
    }
    pclose(pp); //关闭管道
    return resvec.size();
}